

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_reset_clears_pipeline_Test::CpuTest_reset_clears_pipeline_Test
          (CpuTest_reset_clears_pipeline_Test *this)

{
  CpuTest_reset_clears_pipeline_Test *this_local;
  
  n_e_s::core::test::CpuTest::CpuTest(&this->super_CpuTest);
  (this->super_CpuTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CpuTest_reset_clears_pipeline_Test_003e6c68;
  return;
}

Assistant:

TEST_F(CpuTest, reset_clears_pipeline) {
    stage_instruction(SEC);
    EXPECT_CALL(mmu, read_byte(kResetAddress)).WillOnce(Return(0xAD));
    EXPECT_CALL(mmu, read_byte(kResetAddress + 1u)).WillOnce(Return(0xDE));
    EXPECT_CALL(mmu, read_byte(0xDEAD)).WillOnce(Return(0x00));
    expected.pc = 0xDEAD + 1;

    cpu->execute(); // Stage things for execution.
    cpu->reset();
    cpu->execute(); // Should read an opcode from 0xDEAD and not execute what's
                    // been staged.

    EXPECT_EQ(expected, registers);
}